

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::AppendCatch(BinaryReaderIR *this,Catch *catch_)

{
  pointer pLVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char *format;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->label_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1;
  if (lVar4 == 0) {
    PrintError(this,"accessing stack depth: %u >= max: %zd",0,0);
  }
  else {
    if (*(int *)((long)pLVar1 + lVar4 + -0x18) == 6) {
      lVar2 = *(long *)((long)pLVar1 + lVar4 + -8);
      if (*(int *)(lVar2 + 0x38) != 0x3c) {
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                      ,0x4e,
                      "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]");
      }
      if (((((catch_->var).type_ == Index) && ((catch_->var).field_2.index_ == 0xffffffff)) &&
          (lVar3 = *(long *)(lVar2 + 400), *(long *)(lVar2 + 0x188) != lVar3)) &&
         ((*(int *)(lVar3 + -0x40) == 0 && (*(int *)(lVar3 + -0x38) == -1)))) {
        format = "only one catch_all allowed in try block";
      }
      else {
        if (*(int *)(lVar2 + 0x3c) == 1) {
LAB_0011c74d:
          std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::emplace_back<wabt::Catch>
                    ((vector<wabt::Catch,_std::allocator<wabt::Catch>_> *)(lVar2 + 0x188),catch_);
          *(long *)((long)pLVar1 + lVar4 + -0x10) = *(long *)(lVar2 + 400) + -0x18;
          return (Result)Ok;
        }
        if (*(int *)(lVar2 + 0x3c) == 0) {
          *(undefined4 *)(lVar2 + 0x3c) = 1;
          goto LAB_0011c74d;
        }
        format = "catch not allowed in try-delegate";
      }
    }
    else {
      format = "catch not inside try block";
    }
    PrintError(this,format);
  }
  return (Result)Error;
}

Assistant:

Result BinaryReaderIR::GetLabelAt(LabelNode** label, Index depth) {
  if (depth >= label_stack_.size()) {
    PrintError("accessing stack depth: %" PRIindex " >= max: %" PRIzd, depth,
               label_stack_.size());
    return Result::Error;
  }

  *label = &label_stack_[label_stack_.size() - depth - 1];
  return Result::Ok;
}